

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatBuffer.h
# Opt level: O0

void __thiscall
slang::FormatBuffer::format<int,std::basic_string_view<char,std::char_traits<char>>const>
          (FormatBuffer *this,format_string<int,_const_std::basic_string_view<char>_> fmt,int *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1)

{
  string_view fmt_00;
  undefined4 *in_RCX;
  buffer<char> *in_stack_00000038;
  locale_ref in_stack_00000040;
  format_args in_stack_00000048;
  locale_ref local_b0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff58;
  value<fmt::v11::context> *in_stack_ffffffffffffff60;
  undefined8 local_80;
  undefined1 *local_78;
  undefined1 local_48 [16];
  undefined1 *local_38;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined4 local_c;
  undefined1 *local_8;
  
  local_38 = local_48;
  local_c = *in_RCX;
  local_8 = &stack0xffffffffffffff58;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_18 = &local_80;
  local_20 = &stack0xffffffffffffff58;
  local_80 = 0xd1;
  local_78 = local_20;
  ::fmt::v11::detail::locale_ref::locale_ref(&local_b0);
  fmt_00.size_ = (size_t)args;
  fmt_00.data_ = (char *)args_1;
  ::fmt::v11::detail::vformat_to(in_stack_00000038,fmt_00,in_stack_00000048,in_stack_00000040);
  return;
}

Assistant:

void format(fmt::format_string<Args...> fmt, Args&&... args) {
        fmt::detail::vformat_to(buf, fmt::string_view(fmt), fmt::make_format_args(args...));
    }